

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall
pbrt::Transform::Decompose(Transform *this,Vector3f *T,SquareMatrix<4> *R,SquareMatrix<4> *S)

{
  ulong uVar1;
  undefined1 auVar2 [64];
  int i_3;
  Float (*paFVar3) [4];
  undefined1 (*pauVar4) [16];
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  Float *pFVar10;
  Float aFVar11 [4];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  SquareMatrix<4> Rnext;
  SquareMatrix<4> r;
  SquareMatrix<4> Rit;
  SquareMatrix<4> M;
  undefined1 *puStack_160;
  Float local_158;
  float fStack_154;
  Float FStack_150;
  float fStack_14c;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  char local_118;
  Float local_108;
  float fStack_104;
  Float FStack_100;
  float fStack_fc;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  Float local_c8;
  float fStack_c4;
  Float FStack_c0;
  float fStack_bc;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pFVar10 = &local_158;
  (T->super_Tuple3<pbrt::Vector3,_float>).x = (this->m).m[0][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).y = (this->m).m[1][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).z = (this->m).m[2][3];
  local_68 = *(undefined8 *)(this->m).m[0];
  uStack_60 = *(undefined8 *)((this->m).m[0] + 2);
  uStack_58 = *(undefined8 *)(this->m).m[1];
  uStack_50 = *(undefined8 *)((this->m).m[1] + 2);
  uStack_48 = *(undefined8 *)(this->m).m[2];
  uStack_40 = *(undefined8 *)((this->m).m[2] + 2);
  uStack_30 = 0;
  uStack_38 = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (long)&uStack_60 + 4;
  vscatterdps_avx512vl
            (auVar15 + _DAT_004d01b0,CONCAT71((int7)((ulong)S >> 8),7) & 0xffffffff,
             ZEXT816(0) << 0x40);
  uStack_2c = 0x3f800000;
  auVar16._60_4_ = 0x3f800000;
  auVar16._0_60_ = ZEXT4860(*(undefined1 (*) [48])(this->m).m);
  *(undefined1 (*) [64])R->m = auVar16;
  auVar12 = vpbroadcastq_avx512vl();
  local_88 = vpaddq_avx2(auVar12,_DAT_004b91a0);
  uVar9 = 0;
  auVar12 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  do {
    auVar14 = local_88;
    lVar5 = 0;
    paFVar3 = (Float (*) [4])&local_108;
    do {
      auVar13 = vpbroadcastq_avx512vl();
      uVar1 = vpcmpeqq_avx512vl(auVar13,auVar12);
      auVar15 = vpmovm2d_avx512vl(uVar1 & 0xf);
      auVar15 = vpsrld_avx(auVar15,0x1f);
      aFVar11 = (Float  [4])vcvtdq2ps_avx(auVar15);
      *paFVar3 = aFVar11;
      lVar5 = lVar5 + 1;
      paFVar3 = paFVar3 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    paFVar3 = (Float (*) [4])&local_108;
    do {
      auVar12 = vpbroadcastq_avx512vl();
      auVar12 = vpsllq_avx2(auVar12,2);
      vpaddq_avx2(auVar14,auVar12);
      aFVar11 = (Float  [4])vgatherqps_avx512vl(*(undefined8 *)*paFVar3);
      *paFVar3 = aFVar11;
      lVar5 = lVar5 + 1;
      paFVar3 = paFVar3 + 1;
    } while (lVar5 != 4);
    puStack_160 = (undefined1 *)0x30dcfe;
    Inverse<4>((SquareMatrix<4> *)&local_108);
    if (local_118 == '\0') {
      puStack_160 = (undefined1 *)0x30df09;
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
    }
    local_c8 = local_158;
    fStack_c4 = fStack_154;
    FStack_c0 = FStack_150;
    fStack_bc = fStack_14c;
    uStack_b8 = uStack_148;
    uStack_b0 = uStack_140;
    uStack_a8 = uStack_138;
    uStack_a0 = uStack_130;
    uStack_98 = uStack_128;
    uStack_90 = uStack_120;
    _local_108 = *(undefined8 *)R->m[0];
    _FStack_100 = *(undefined8 *)(R->m[0] + 2);
    uStack_f8 = *(undefined8 *)R->m[1];
    uStack_f0 = *(undefined8 *)(R->m[1] + 2);
    uStack_e8 = *(undefined8 *)R->m[2];
    uStack_e0 = *(undefined8 *)(R->m[2] + 2);
    uStack_d8 = *(undefined8 *)R->m[3];
    uStack_d0 = *(undefined8 *)(R->m[3] + 2);
    lVar5 = 0;
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    do {
      *(float *)((long)&local_108 + lVar5) =
           *(float *)((long)&local_c8 + lVar5) + *(float *)((long)&local_108 + lVar5);
      *(float *)((long)&fStack_104 + lVar5) =
           *(float *)((long)&fStack_c4 + lVar5) + *(float *)((long)&fStack_104 + lVar5);
      *(float *)((long)&FStack_100 + lVar5) =
           *(float *)((long)&FStack_c0 + lVar5) + *(float *)((long)&FStack_100 + lVar5);
      *(float *)((long)&fStack_fc + lVar5) =
           *(float *)((long)&fStack_bc + lVar5) + *(float *)((long)&fStack_fc + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    local_158 = local_108;
    fStack_154 = fStack_104;
    FStack_150 = FStack_100;
    fStack_14c = fStack_fc;
    uStack_148 = uStack_f8;
    uStack_140 = uStack_f0;
    uStack_138 = uStack_e8;
    uStack_130 = uStack_e0;
    uStack_128 = uStack_d8;
    uStack_120 = uStack_d0;
    lVar5 = 0;
    auVar12 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      *(float *)((long)&local_158 + lVar5) = *(float *)((long)&local_158 + lVar5) * 0.5;
      *(float *)((long)&fStack_154 + lVar5) = *(float *)((long)&fStack_154 + lVar5) * 0.5;
      *(float *)((long)&FStack_150 + lVar5) = *(float *)((long)&FStack_150 + lVar5) * 0.5;
      *(float *)((long)&fStack_14c + lVar5) = *(float *)((long)&fStack_14c + lVar5) * 0.5;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    auVar15 = ZEXT416(0) << 0x20;
    lVar5 = 8;
    do {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)((long)(R->m + -1) + 8 + lVar5);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)&puStack_160 + lVar5);
      auVar17 = vsubps_avx(auVar17,auVar18);
      auVar17 = vandps_avx(auVar17,auVar19);
      auVar18 = vhaddps_avx(auVar17,auVar17);
      auVar17 = vandps_avx(ZEXT416((uint)(*(float *)((long)R->m[0] + lVar5) -
                                         *(float *)((long)&local_158 + lVar5))),auVar19);
      auVar15 = vmaxss_avx(ZEXT416((uint)(auVar18._0_4_ + auVar17._0_4_)),auVar15);
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x38);
    auVar2._8_4_ = FStack_150;
    auVar2._12_4_ = fStack_14c;
    auVar2._0_4_ = local_158;
    auVar2._4_4_ = fStack_154;
    auVar2._16_8_ = uStack_148;
    auVar2._24_8_ = uStack_140;
    auVar2._32_8_ = uStack_138;
    auVar2._40_8_ = uStack_130;
    auVar2._48_8_ = uStack_128;
    auVar2._56_8_ = uStack_120;
    *(undefined1 (*) [64])R->m = auVar2;
    if (0x62 < uVar9) break;
    uVar9 = uVar9 + 1;
  } while (0.0001 < auVar15._0_4_);
  puStack_160 = (undefined1 *)0x30de15;
  Inverse<4>(R);
  if (local_118 != '\0') {
    pauVar4 = (undefined1 (*) [16])&local_c8;
    lVar5 = 0;
    auVar12 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    do {
      auVar14 = vpbroadcastq_avx512vl();
      uVar1 = vpcmpeqq_avx512vl(auVar14,auVar12);
      auVar15 = vpmovm2d_avx512vl(uVar1 & 0xf);
      auVar15 = vpsrld_avx(auVar15,0x1f);
      auVar15 = vcvtdq2ps_avx(auVar15);
      *pauVar4 = auVar15;
      lVar5 = lVar5 + 1;
      pauVar4 = pauVar4 + 1;
    } while (lVar5 != 4);
    lVar5 = 0;
    do {
      lVar7 = 0;
      puVar6 = &local_68;
      do {
        (&local_c8)[lVar5 * 4 + lVar7] = 0.0;
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        lVar8 = 0;
        do {
          auVar15 = vfmadd231ss_fma(auVar16._0_16_,ZEXT416(*(uint *)((long)pFVar10 + lVar8)),
                                    ZEXT416(*(uint *)((long)puVar6 + lVar8 * 4)));
          auVar16 = ZEXT1664(auVar15);
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
        (&local_c8)[lVar5 * 4 + lVar7] = auVar15._0_4_;
        lVar7 = lVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 4);
      } while (lVar7 != 4);
      lVar5 = lVar5 + 1;
      pFVar10 = (Float *)((long)pFVar10 + 0x10);
    } while (lVar5 != 4);
    *(undefined8 *)S->m[0] = _local_c8;
    *(undefined8 *)(S->m[0] + 2) = _FStack_c0;
    *(undefined8 *)S->m[1] = uStack_b8;
    *(undefined8 *)(S->m[1] + 2) = uStack_b0;
    *(undefined8 *)S->m[2] = uStack_a8;
    *(undefined8 *)(S->m[2] + 2) = uStack_a0;
    *(undefined8 *)S->m[3] = uStack_98;
    *(undefined8 *)(S->m[3] + 2) = uStack_90;
    return;
  }
  puStack_160 = &LAB_0030df2d;
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
}

Assistant:

void Transform::Decompose(Vector3f *T, SquareMatrix<4> *R, SquareMatrix<4> *S) const {
    // Extract translation _T_ from transformation matrix
    T->x = m[0][3];
    T->y = m[1][3];
    T->z = m[2][3];

    // Compute new transformation matrix _M_ without translation
    SquareMatrix<4> M = m;
    for (int i = 0; i < 3; ++i)
        M[i][3] = M[3][i] = 0.f;
    M[3][3] = 1.f;

    // Extract rotation _R_ from transformation matrix
    Float norm;
    int count = 0;
    *R = M;
    do {
        // Compute next matrix _Rnext_ in series
        SquareMatrix<4> Rit = *Inverse(Transpose(*R));
        SquareMatrix<4> Rnext = (*R + Rit) / 2;

        // Compute norm of difference between _R_ and _Rnext_
        norm = 0;
        for (int i = 0; i < 3; ++i) {
            Float n = std::abs((*R)[i][0] - Rnext[i][0]) +
                      std::abs((*R)[i][1] - Rnext[i][1]) +
                      std::abs((*R)[i][2] - Rnext[i][2]);
            norm = std::max(norm, n);
        }

        *R = Rnext;
    } while (++count < 100 && norm > .0001);
    // XXX TODO FIXME deal with flip...

    // Compute scale _S_ using rotation and original matrix
    *S = *Inverse(*R) * M;
}